

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cpp.cpp
# Opt level: O0

void __thiscall spirv_cross::CompilerCPP::emit_uniform(CompilerCPP *this,SPIRVariable *var)

{
  undefined8 uVar1;
  uint32_t uVar2;
  mapped_type *pmVar3;
  char (*in_stack_fffffffffffffea0) [3];
  char (*in_stack_fffffffffffffeb0) [3];
  SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
  *this_00;
  string local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  string local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  undefined1 local_80 [8];
  string type_name;
  uint32_t local_58;
  uint32_t location;
  uint32_t binding;
  uint32_t local_44;
  undefined1 local_40 [4];
  uint32_t descriptor_set;
  string instance_name;
  SPIRType *type;
  SPIRVariable *var_local;
  CompilerCPP *this_local;
  
  uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(var->super_IVariant).self);
  CompilerGLSL::add_resource_name(&this->super_CompilerGLSL,uVar2);
  uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(var->super_IVariant).field_0xc);
  instance_name.field_2._8_8_ = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,uVar2);
  uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(var->super_IVariant).self);
  (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])(local_40,this,(ulong)uVar2,1);
  pmVar3 = ::std::
           unordered_map<spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>_>
           ::operator[](&(this->super_CompilerGLSL).super_Compiler.ir.meta,
                        &(var->super_IVariant).self);
  local_44 = (pmVar3->decoration).set;
  pmVar3 = ::std::
           unordered_map<spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>_>
           ::operator[](&(this->super_CompilerGLSL).super_Compiler.ir.meta,
                        &(var->super_IVariant).self);
  local_58 = (pmVar3->decoration).binding;
  pmVar3 = ::std::
           unordered_map<spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>_>
           ::operator[](&(this->super_CompilerGLSL).super_Compiler.ir.meta,
                        &(var->super_IVariant).self);
  type_name.field_2._12_4_ = (pmVar3->decoration).location;
  (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
            (local_80,this,instance_name.field_2._8_8_,0);
  Compiler::remap_variable_type_name
            ((Compiler *)this,(SPIRType *)instance_name.field_2._8_8_,(string *)local_40,
             (string *)local_80);
  uVar1 = instance_name.field_2._8_8_;
  if (((*(int *)(instance_name.field_2._8_8_ + 0x10) == 0x10) ||
      (*(int *)(instance_name.field_2._8_8_ + 0x10) == 0x11)) ||
     (*(int *)(instance_name.field_2._8_8_ + 0x10) == 0xb)) {
    uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(var->super_IVariant).self);
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x27])
              (&local_a0,this,uVar1,(ulong)uVar2);
    CompilerGLSL::
    statement<char_const(&)[20],std::__cxx11::string&,std::__cxx11::string,char_const(&)[3],std::__cxx11::string&,char_const(&)[4]>
              (&this->super_CompilerGLSL,(char (*) [20])"internal::Resource<",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80,
               &local_a0,(char (*) [3])0x5b6d40,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
               (char (*) [4])"__;");
    ::std::__cxx11::string::~string((string *)&local_a0);
    CompilerGLSL::
    statement_no_indent<char_const(&)[9],std::__cxx11::string&,char_const(&)[9],std::__cxx11::string&,char_const(&)[9]>
              (&this->super_CompilerGLSL,(char (*) [9])"#define ",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
               (char (*) [9])" __res->",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
               (char (*) [9])"__.get()");
    join<char_const(&)[21],std::__cxx11::string&,char_const(&)[3],char_const(&)[3],unsigned_int&,char_const(&)[3],unsigned_int&,char_const(&)[3]>
              (&local_c0,(spirv_cross *)"s.register_resource(",(char (*) [21])local_40,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x59ea49,
               (char (*) [3])0x5a8753,(char (*) [3])&local_44,(uint *)0x5a8753,
               (char (*) [3])&local_58,(uint *)0x5b6d88,in_stack_fffffffffffffeb0);
    SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
    ::push_back(&this->resource_registrations,&local_c0);
    ::std::__cxx11::string::~string((string *)&local_c0);
  }
  else {
    uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(var->super_IVariant).self);
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x27])
              (&local_e0,this,uVar1,(ulong)uVar2);
    CompilerGLSL::
    statement<char_const(&)[27],std::__cxx11::string&,std::__cxx11::string,char_const(&)[3],std::__cxx11::string&,char_const(&)[4]>
              (&this->super_CompilerGLSL,(char (*) [27])"internal::UniformConstant<",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80,
               &local_e0,(char (*) [3])0x5b6d40,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
               (char (*) [4])"__;");
    ::std::__cxx11::string::~string((string *)&local_e0);
    CompilerGLSL::
    statement_no_indent<char_const(&)[9],std::__cxx11::string&,char_const(&)[9],std::__cxx11::string&,char_const(&)[9]>
              (&this->super_CompilerGLSL,(char (*) [9])"#define ",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
               (char (*) [9])" __res->",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
               (char (*) [9])"__.get()");
    this_00 = &this->resource_registrations;
    join<char_const(&)[29],std::__cxx11::string&,char_const(&)[3],char_const(&)[3],unsigned_int&,char_const(&)[3]>
              (&local_100,(spirv_cross *)"s.register_uniform_constant(",(char (*) [29])local_40,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x59ea49,
               (char (*) [3])0x5a8753,(char (*) [3])((long)&type_name.field_2 + 0xc),
               (uint *)0x5b6d88,in_stack_fffffffffffffea0);
    SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
    ::push_back(this_00,&local_100);
    ::std::__cxx11::string::~string((string *)&local_100);
  }
  CompilerGLSL::statement<char_const(&)[1]>(&this->super_CompilerGLSL,(char (*) [1])0x563e71);
  ::std::__cxx11::string::~string((string *)local_80);
  ::std::__cxx11::string::~string((string *)local_40);
  return;
}

Assistant:

void CompilerCPP::emit_uniform(const SPIRVariable &var)
{
	add_resource_name(var.self);

	auto &type = get<SPIRType>(var.basetype);
	auto instance_name = to_name(var.self);

	uint32_t descriptor_set = ir.meta[var.self].decoration.set;
	uint32_t binding = ir.meta[var.self].decoration.binding;
	uint32_t location = ir.meta[var.self].decoration.location;

	string type_name = type_to_glsl(type);
	remap_variable_type_name(type, instance_name, type_name);

	if (type.basetype == SPIRType::Image || type.basetype == SPIRType::SampledImage ||
	    type.basetype == SPIRType::AtomicCounter)
	{
		statement("internal::Resource<", type_name, type_to_array_glsl(type, var.self), "> ", instance_name, "__;");
		statement_no_indent("#define ", instance_name, " __res->", instance_name, "__.get()");
		resource_registrations.push_back(
		    join("s.register_resource(", instance_name, "__", ", ", descriptor_set, ", ", binding, ");"));
	}
	else
	{
		statement("internal::UniformConstant<", type_name, type_to_array_glsl(type, var.self), "> ", instance_name, "__;");
		statement_no_indent("#define ", instance_name, " __res->", instance_name, "__.get()");
		resource_registrations.push_back(
		    join("s.register_uniform_constant(", instance_name, "__", ", ", location, ");"));
	}

	statement("");
}